

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_method.c
# Opt level: O0

method_conflict
method_create(klass cls,char *name,size_t args_count,method_impl impl,class_visibility_id visibility
             ,async_id async,method_impl_interface_singleton singleton)

{
  size_t sVar1;
  char *pcVar2;
  signature psVar3;
  method_impl in_RCX;
  char *in_RSI;
  klass in_RDI;
  class_visibility_id in_R8D;
  async_id in_R9D;
  size_t size;
  method_conflict m;
  method_interface local_48;
  method_conflict local_8;
  
  local_8 = (method_conflict)malloc(0x30);
  if (local_8 == (method_conflict)0x0) {
    local_8 = (method_conflict)0x0;
  }
  else {
    if (in_RSI == (char *)0x0) {
      local_8->name = (char *)0x0;
    }
    else {
      sVar1 = strlen(in_RSI);
      pcVar2 = (char *)malloc(sVar1 + 1);
      local_8->name = pcVar2;
      if (local_8->name != (char *)0x0) {
        memcpy(local_8->name,in_RSI,sVar1 + 1);
      }
    }
    psVar3 = signature_create((size_t)local_8);
    local_8->s = psVar3;
    if (local_8->s == (signature)0x0) {
      log_write_impl_va("metacall",0x4a,"method_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_method.c"
                        ,LOG_LEVEL_ERROR,"Invalid method signature allocation");
      if (local_8->name != (char *)0x0) {
        free(local_8->name);
      }
      free(local_8);
      local_8 = (method_conflict)0x0;
    }
    else {
      local_8->cls = in_RDI;
      local_8->impl = in_RCX;
      local_8->visibility = in_R8D;
      local_8->async = in_R9D;
      if (size == 0) {
        local_48 = (method_interface)0x0;
      }
      else {
        local_48 = (method_interface)(*(code *)size)();
      }
      local_8->iface = local_48;
    }
  }
  return local_8;
}

Assistant:

method method_create(klass cls, const char *name, size_t args_count, method_impl impl, enum class_visibility_id visibility, enum async_id async, method_impl_interface_singleton singleton)
{
	method m = malloc(sizeof(struct method_type));

	if (m == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t size = strlen(name) + 1;

		m->name = malloc(sizeof(char) * size);

		if (m->name != NULL)
		{
			memcpy(m->name, name, size);
		}
	}
	else
	{
		m->name = NULL;
	}

	m->s = signature_create(args_count);

	if (m->s == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid method signature allocation");

		if (m->name)
		{
			free(m->name);
		}

		free(m);

		return NULL;
	}

	m->cls = cls;
	m->impl = impl;
	m->visibility = visibility;
	m->async = async;
	m->iface = singleton ? singleton() : NULL;

	return m;
}